

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_objectwriter.cc
# Opt level: O1

JsonObjectWriter * __thiscall
google::protobuf::util::converter::JsonObjectWriter::RenderUint64
          (JsonObjectWriter *this,StringPiece name,uint64 value)

{
  StringPiece s;
  char *pcVar1;
  char local_68 [32];
  char *local_48;
  size_t local_40;
  char local_38 [16];
  
  WritePrefix(this,name);
  WriteChar(this,'\"');
  pcVar1 = FastUInt64ToBufferLeft(value,local_68);
  local_48 = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,local_68,pcVar1);
  s.length_ = local_40;
  s.ptr_ = local_48;
  if ((long)local_40 < 0) {
    StringPiece::LogFatalSizeTooBig(local_40,"size_t to int conversion");
  }
  WriteRawString(this,s);
  if (local_48 != local_38) {
    operator_delete(local_48);
  }
  WriteChar(this,'\"');
  return this;
}

Assistant:

JsonObjectWriter* JsonObjectWriter::RenderUint64(StringPiece name,
                                                 uint64 value) {
  WritePrefix(name);
  WriteChar('"');
  WriteRawString(StrCat(value));
  WriteChar('"');
  return this;
}